

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

ostream * operator<<(ostream *os,ipv4_endpoint *endpoint)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  char local_19;
  
  __s = inet_ntoa((in_addr)endpoint->addr_net);
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  local_19 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_19,1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ipv4_endpoint const& endpoint)
{
    in_addr tmp{};
    tmp.s_addr = endpoint.addr_net;
    os << inet_ntoa(tmp) << ':' << endpoint.port();
    return os;
}